

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O2

void slang::OS::printE(text_style *style,string_view text)

{
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  string_view text_00;
  format_string<std::basic_string_view<char>_&> fmt;
  string_view text_local;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  if (capturingOutput) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&capturedStderr_abi_cxx11_,&text_local);
  }
  else {
    if (!showColorsStderr) {
      text_00.size_ = (size_t)&stderr;
      text_00.data_ = (char *)text_local._M_len;
      ::fmt::v11::detail::print((detail *)_stderr,(FILE *)text_local._M_str,text_00);
      return;
    }
    fmt.str.size_ = (size_t)&text_local;
    fmt.str.data_ = (char *)0x2;
    ::fmt::v11::print<std::basic_string_view<char,std::char_traits<char>>&>
              (_stderr,(FILE *)style,(text_style *)0x467559,fmt,in_R9);
  }
  return;
}

Assistant:

void OS::printE(const fmt::text_style& style, std::string_view text) {
    if (capturingOutput)
        capturedStderr += text;
    else if (showColorsStderr)
        fmt::print(stderr, style, "{}"sv, text);
    else
        fmt::detail::print(stderr, fmt::detail::to_string_view(text));
}